

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::serialize
          (XMLSchemaDescriptionImpl *this,XSerializeEngine *serEng)

{
  QName *pQVar1;
  XMLAttDef *pXVar2;
  XSerializeEngine *__nbytes;
  size_t __n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int i;
  XMLSize_t dummyDataLen;
  XMLSize_t dummyBufferLen;
  ContextType local_2c;
  XMLSize_t local_28;
  XMLSize_t local_20;
  
  XMLSchemaDescription::serialize(&this->super_XMLSchemaDescription,serEng);
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,(int *)&local_2c);
    this->fContextType = local_2c;
    if (this->fNamespace != (XMLCh *)0x0) {
      (*((this->super_XMLSchemaDescription).super_XMLGrammarDescription.fMemMgr)->
        _vptr_MemoryManager[4])();
    }
    XSerializeEngine::readString(serEng,&this->fNamespace,&local_20,&local_28,false);
    __nbytes = serEng;
    XTemplateSerializer::loadObject(&this->fLocationHints,4,true,serEng);
    pQVar1 = (QName *)XSerializeEngine::read(serEng,0x4250b0,__buf,(size_t)__nbytes);
    this->fTriggeringComponent = pQVar1;
    pQVar1 = (QName *)XSerializeEngine::read(serEng,0x4250b0,__buf_00,(size_t)__nbytes);
    this->fEnclosingElementName = pQVar1;
    pXVar2 = (XMLAttDef *)XSerializeEngine::read(serEng,0x445598,__buf_01,(size_t)__nbytes);
    this->fAttributes = pXVar2;
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fContextType);
  __n = 0;
  XSerializeEngine::writeString(serEng,this->fNamespace,0,false);
  XTemplateSerializer::storeObject(this->fLocationHints,serEng);
  XSerializeEngine::write(serEng,(int)this->fTriggeringComponent,__buf_02,__n);
  XSerializeEngine::write(serEng,(int)this->fEnclosingElementName,__buf_03,__n);
  XSerializeEngine::write(serEng,(int)this->fAttributes,__buf_04,__n);
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::serialize(XSerializeEngine& serEng)
{
    XMLSchemaDescription::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng<<(int)fContextType;       
        serEng.writeString(fNamespace);

        /***
         * 
         * Serialize RefArrayVectorOf<XMLCh>*               fLocationHints;
         *
         ***/
        XTemplateSerializer::storeObject(fLocationHints, serEng);

        QName* tempQName = (QName*)fTriggeringComponent;
        serEng<<tempQName;
        tempQName = (QName*)fEnclosingElementName;
        serEng<<tempQName;

        XMLAttDef* tempAttDef = (XMLAttDef*)fAttributes;
        serEng<<tempAttDef;
    }

    else
    {
        int i;
        serEng>>i;

        fContextType = (ContextType)i;       

        //the original fNamespace which came from the ctor needs deallocated
        if (fNamespace)
        {
            XMLGrammarDescription::getMemoryManager()->deallocate((void*)fNamespace);
        }
        serEng.readString((XMLCh*&)fNamespace);

        /***
         *
         *  Deserialize RefArrayVectorOf<XMLCh>    fLocationHints     
         *
         ***/
        XTemplateSerializer::loadObject(&fLocationHints, 4, true, serEng);

        QName* tempQName;
        serEng>>tempQName;
        fTriggeringComponent = tempQName;

        serEng>>tempQName;
        fEnclosingElementName = tempQName;

        XMLAttDef* tempAttDef;
        serEng>>tempAttDef;
        fAttributes=tempAttDef;

    }

}